

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O1

int mraa_intel_edison_mmap_read(mraa_gpio_context dev)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = dev->pin;
  uVar2 = uVar1 + 0x1f;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  return (int)((*(uint *)(mmap_reg + (ulong)(uVar2 >> 3 & 0xfc) + 4) >> (uVar1 & 0x1f) & 1) != 0);
}

Assistant:

int
mraa_intel_edison_mmap_read(mraa_gpio_context dev)
{
    uint8_t offset = ((dev->pin / 32) * sizeof(uint32_t));
    uint32_t value;

    value = *(volatile uint32_t*) (mmap_reg + 0x04 + offset);
    if (value & (uint32_t)(1 << (dev->pin % 32))) {
        return 1;
    }
    return 0;
}